

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

bool addkeyword(int type,char *name)

{
  ident local_40;
  
  local_40.field_4.args = "";
  local_40.field_5.argmask = 0;
  local_40.fun = (identfun)0x0;
  local_40.flags = 0;
  local_40.type = type;
  local_40.name = name;
  addident(&local_40);
  return true;
}

Assistant:

bool addkeyword(int type, const char *name)
{
    addident(ident(type, name, "", 0, NULL));
    return true;
}